

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.h
# Opt level: O0

void __thiscall mocker::nasm::Module::Module(Module *this,Module *param_1)

{
  Module *param_1_local;
  Module *this_local;
  
  std::
  vector<std::shared_ptr<mocker::nasm::Directive>,_std::allocator<std::shared_ptr<mocker::nasm::Directive>_>_>
  ::vector(&this->directives,&param_1->directives);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>_>_>
  ::unordered_map(&this->sections,&param_1->sections);
  return;
}

Assistant:

Module(const Module &) = default;